

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  LoadResult LVar1;
  undefined1 uVar2;
  bool bVar3;
  __type_conflict1 _Var4;
  int iVar5;
  pointer pDVar6;
  DBErrors *pDVar7;
  long *in_RSI;
  ConstevalFormatString<1U> in_R8;
  long in_FS_OFFSET;
  Status status;
  DBErrors record_res;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  DataStream ssValue;
  DataStream ssKey;
  LoadResult result;
  string error;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  DBErrors in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffee0;
  CWallet *in_stack_fffffffffffffee8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [15];
  byte local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_70 [32];
  DBErrors local_50;
  int iStack_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  LoadResult::LoadResult((LoadResult *)in_stack_fffffffffffffe98);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffe98);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffe98);
  uVar2 = DataStream::empty((DataStream *)in_stack_fffffffffffffea8);
  local_99 = ~uVar2 & 1;
  inline_assertion_check<false,bool>
            ((bool *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             (char *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_stack_fffffffffffffea8,
             (DataStream *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  (**(code **)(*in_RSI + 0x50))(local_a8,in_RSI,local_b8,local_b0);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                      *)in_stack_fffffffffffffe98);
  if (bVar3) {
    while( true ) {
      pDVar6 = std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
               ::operator->((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                             *)in_stack_fffffffffffffe98);
      iVar5 = (*pDVar6->_vptr_DatabaseCursor[2])(pDVar6,local_70,&local_98);
      if (iVar5 == 2) break;
      if (iVar5 == 0) {
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  (in_stack_fffffffffffffee8,in_R8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffee0));
        local_50 = CORRUPT;
        break;
      }
      __rhs = &local_28;
      std::__cxx11::string::string(in_stack_fffffffffffffeb0);
      DataStream::operator>>((DataStream *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(iVar5,in_stack_fffffffffffffec8),__rhs);
      if (!_Var4) {
        __assert_fail("type == key",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
                      ,0x209,
                      "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                     );
      }
      in_stack_fffffffffffffeb0 = &local_48;
      std::__cxx11::string::string(in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffebc =
           std::
           function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()((function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)__rhs,(CWallet *)CONCAT44(iVar5,in_stack_fffffffffffffec8),
                        (DataStream *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        (DataStream *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (in_stack_fffffffffffffebc != LOAD_OK) {
        in_stack_fffffffffffffee8 = (CWallet *)0x9ad71d;
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  ((CWallet *)0x9ad71d,in_R8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffee0));
      }
      pDVar7 = std::max<wallet::DBErrors>
                         ((DBErrors *)in_stack_fffffffffffffea0,
                          (DBErrors *)in_stack_fffffffffffffe98);
      local_50 = *pDVar7;
      iStack_4c = iStack_4c + 1;
      std::__cxx11::string::~string(in_stack_fffffffffffffe98);
      std::__cxx11::string::~string(in_stack_fffffffffffffe98);
    }
  }
  else {
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (in_stack_fffffffffffffee8,in_R8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffee0));
    local_50 = CORRUPT;
  }
  std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>::~unique_ptr
            ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *)
             in_stack_fffffffffffffea8);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffe98);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffe98);
  LVar1.m_records = iStack_4c;
  LVar1.m_result = local_50;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return LVar1;
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}